

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::Temperature> metaf::Temperature::fromRemarkString(string *s)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  double dVar9;
  optional<metaf::Temperature> oVar10;
  
  if (s->_M_string_length == 4) {
    pbVar2 = (byte *)(s->_M_dataplus)._M_p;
    bVar1 = *pbVar2;
    if ((bVar1 & 0xfe) == 0x30) {
      lVar7 = 1;
      iVar6 = 0;
      do {
        bVar8 = pbVar2[lVar7] - 0x30;
        if (9 < bVar8) goto LAB_001aaa54;
        iVar6 = (uint)bVar8 + iVar6 * 10;
        lVar7 = lVar7 + 1;
      } while ((int)lVar7 != 4);
      iVar3 = -iVar6;
      if (bVar1 != 0x31) {
        iVar3 = iVar6;
      }
      uVar5 = 0x100000000;
      dVar9 = round((double)((float)iVar3 / 10.0) * 10.0);
      uVar4 = (ulong)(uint)(int)dVar9;
      lVar7 = (ulong)((float)iVar3 / 10.0 < 0.0) + 0x100000100;
      goto LAB_001aaa58;
    }
  }
LAB_001aaa54:
  lVar7 = 0;
  uVar4 = 0;
  uVar5 = 0;
LAB_001aaa58:
  oVar10.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._M_payload._0_8_ = uVar4 | uVar5;
  oVar10.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._8_8_ = lVar7;
  return (optional<metaf::Temperature>)
         oVar10.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Temperature>;
}

Assistant:

std::optional<Temperature> Temperature::fromRemarkString(const std::string & s) {
	//static const std::regex ("([01])(\\d\\d\\d)");
	std::optional<Temperature> error;
	if (s.length() != 4) return error;
	if (s[0] != '0' && s[0] != '1') return error;
	const auto t = strToUint(s, 1, 3);
	if (!t.has_value()) return error;
	int tValueSigned = int(*t);
	if (s[0] == '1') tValueSigned = -tValueSigned;
	return Temperature(tValueSigned / 10.0f);
}